

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Vec_Int_t * Abc_NtkGetLatchValues(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Int_t *p;
  Abc_Obj_t *pObj;
  int local_24;
  int i;
  Abc_Obj_t *pLatch;
  Vec_Int_t *vInits;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkLatchNum(pNtk);
  p = Vec_IntAlloc(iVar1);
  local_24 = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vBoxes);
    if (iVar1 <= local_24) {
      return p;
    }
    pObj = Abc_NtkBox(pNtk,local_24);
    iVar1 = Abc_ObjIsLatch(pObj);
    if (iVar1 != 0) {
      iVar1 = Abc_LatchIsInit0(pObj);
      if (iVar1 == 0) {
        iVar1 = Abc_LatchIsInit1(pObj);
        if (iVar1 == 0) {
          iVar1 = Abc_LatchIsInitDc(pObj);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                          ,0x559,"Vec_Int_t *Abc_NtkGetLatchValues(Abc_Ntk_t *)");
          }
          Vec_IntPush(p,2);
        }
        else {
          Vec_IntPush(p,1);
        }
      }
      else {
        Vec_IntPush(p,0);
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Abc_NtkGetLatchValues( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vInits;
    Abc_Obj_t * pLatch;
    int i;
    vInits = Vec_IntAlloc( Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        if ( Abc_LatchIsInit0(pLatch) )
            Vec_IntPush( vInits, 0 );
        else if ( Abc_LatchIsInit1(pLatch) )
            Vec_IntPush( vInits, 1 );
        else if ( Abc_LatchIsInitDc(pLatch) )
            Vec_IntPush( vInits, 2 );
        else
            assert( 0 );
    }
    return vInits;
}